

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O2

int array_list_del_idx(array_list *arr,size_t idx,size_t count)

{
  void **ppvVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = -1;
  uVar3 = count + idx;
  if ((!CARRY8(count,idx)) && (uVar4 = idx, uVar3 <= arr->length && idx < arr->length)) {
    for (; ppvVar1 = arr->array, uVar4 < uVar3; uVar4 = uVar4 + 1) {
      if (ppvVar1[uVar4] != (void *)0x0) {
        (*arr->free_fn)(ppvVar1[uVar4]);
      }
    }
    memmove(ppvVar1 + idx,ppvVar1 + uVar3,(arr->length - uVar3) * 8);
    arr->length = arr->length - count;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int array_list_del_idx(struct array_list *arr, size_t idx, size_t count)
{
	size_t i, stop;

	/* Avoid overflow in calculation with large indices. */
	if (idx > SIZE_T_MAX - count)
		return -1;
	stop = idx + count;
	if (idx >= arr->length || stop > arr->length)
		return -1;
	for (i = idx; i < stop; ++i)
	{
		// Because put_idx can skip entries, we need to check if
		// there's actually anything in each slot we're erasing.
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	}
	memmove(arr->array + idx, arr->array + stop, (arr->length - stop) * sizeof(void *));
	arr->length -= count;
	return 0;
}